

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::to_seq(Tree *this,size_t node,csubstr key,type_bits more_flags)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  bool bVar6;
  size_t sVar7;
  NodeData *pNVar8;
  csubstr cVar9;
  char msg [37];
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  size_t local_60;
  size_t local_38;
  
  bVar6 = has_children(this,node);
  if (bVar6) {
    builtin_strncpy(msg + 0x10," has_chi",8);
    builtin_strncpy(msg,"check failed: (!",0x10);
    builtin_strncpy(msg + 0x18,"ldren(node))",0xd);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_38 = cVar9.len;
    auVar4 = ZEXT1224(ZEXT412(0x67ea) << 0x40);
    LVar3.name.str._0_4_ = (int)cVar9.str;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = cVar9.str._4_4_;
    LVar3.name.len = local_38;
    (*p_Var1)(msg,0x25,LVar3,(this->m_callbacks).m_user_data);
  }
  sVar7 = parent(this,node);
  if (sVar7 != 0xffffffffffffffff) {
    bVar6 = has_parent(this,node);
    if (!bVar6) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      join_0x00000010_0x00000000_ =
           to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x15;
      msg[9] = 'K';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      (*(code *)PTR_error_impl_002867d8)
                ("check failed: has_parent(node)",0x1e,(anonymous_namespace)::s_default_callbacks);
    }
    pNVar8 = _p(this,node);
    pNVar8 = _p(this,pNVar8->m_parent);
    if (((pNVar8->m_type).type & MAP) == NOTYPE) {
      builtin_strncpy(msg,"check failed: (parent(node) == NONE |",0x25);
      uStack_a3 = '|';
      uStack_a2 = ' ';
      uStack_a1 = 'p';
      if (((byte)s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar9 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      local_60 = cVar9.len;
      auVar4 = ZEXT1224(ZEXT412(0x67eb) << 0x40);
      LVar5.name.str._0_4_ = (int)cVar9.str;
      LVar5.super_LineCol.offset = auVar4._0_8_;
      LVar5.super_LineCol.line = auVar4._8_8_;
      LVar5.super_LineCol.col = auVar4._16_8_;
      LVar5.name.str._4_4_ = cVar9.str._4_4_;
      LVar5.name.len = local_60;
      (*p_Var1)(msg,0x3c,LVar5,(this->m_callbacks).m_user_data);
    }
  }
  _set_flags(this,node,more_flags | 10);
  pNVar8 = _p(this,node);
  (pNVar8->m_key).tag.str = (char *)0x0;
  (pNVar8->m_key).tag.len = 0;
  (pNVar8->m_key).scalar.str = key.str;
  (pNVar8->m_key).scalar.len = key.len;
  (pNVar8->m_key).anchor.str = (char *)0x0;
  (pNVar8->m_key).anchor.len = 0;
  pNVar8 = _p(this,node);
  (pNVar8->m_val).tag.str = (char *)0x0;
  (pNVar8->m_val).tag.len = 0;
  (pNVar8->m_val).scalar.str = (char *)0x0;
  (pNVar8->m_val).scalar.len = 0;
  (pNVar8->m_val).anchor.str = (char *)0x0;
  (pNVar8->m_val).anchor.len = 0;
  return;
}

Assistant:

void Tree::to_seq(size_t node, csubstr key, type_bits more_flags)
{
    _RYML_CB_ASSERT(m_callbacks,  ! has_children(node));
    _RYML_CB_ASSERT(m_callbacks, parent(node) == NONE || parent_is_map(node));
    _set_flags(node, KEY|SEQ|more_flags);
    _p(node)->m_key = key;
    _p(node)->m_val.clear();
}